

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatTest_JoinArg_Test::TestBody(FormatTest_JoinArg_Test *this)

{
  string_view sep;
  string_view sep_00;
  string_view sep_01;
  string_view sep_02;
  string_view sep_03;
  wstring_view sep_04;
  string_view sep_05;
  string_view sep_06;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> end;
  string_view sep_07;
  string_view sep_08;
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  void *v3 [2];
  vector<float,_std::allocator<float>_> v2;
  int v1 [3];
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  int line;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  Type in_stack_fffffffffffffa1c;
  Type type;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffffa20;
  arg_join<__gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>,_char>
  *args;
  wchar_t (*in_stack_fffffffffffffa28) [5];
  basic_string_view<char> *format_str;
  undefined7 in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa3f;
  arg_join<int_*,_char> *args_00;
  Message *format_str_00;
  Message *in_stack_fffffffffffffa68;
  Message *message;
  AssertHelper *in_stack_fffffffffffffa70;
  string local_4b0 [32];
  AssertionResult local_490 [5];
  string local_440 [32];
  AssertionResult local_420 [5];
  string local_3d0 [32];
  string local_3b0 [32];
  AssertionResult local_390 [2];
  undefined4 local_36c;
  string local_338 [32];
  AssertionResult local_318 [5];
  wstring local_2c8 [32];
  AssertionResult local_2a8 [3];
  float *local_278;
  float *local_270;
  string local_248 [32];
  AssertionResult local_228 [5];
  string local_1d8 [32];
  AssertionResult local_1b8 [5];
  string local_168 [32];
  AssertionResult local_148 [5];
  string local_f8 [32];
  AssertionResult local_d8 [5];
  string local_88 [32];
  AssertionResult local_68;
  arg_join<__gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>,_char>
  local_58;
  undefined4 local_34;
  undefined1 local_18 [8];
  undefined4 local_10;
  Message local_c;
  
  local_18 = (undefined1  [8])0x200000001;
  local_10 = 3;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x17af41);
  local_34 = 0x3f99999a;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff9f0,
             (value_type_conflict2 *)in_stack_fffffffffffff9e8);
  local_58.sep.data_._0_4_ = 0x4059999a;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff9f0,
             (value_type_conflict2 *)in_stack_fffffffffffff9e8);
  local_58.begin._M_current = (float *)local_18;
  local_58.end._M_current = (float *)(local_18 + 4);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8)
  ;
  sep.data_._4_4_ = in_stack_fffffffffffffa0c;
  sep.data_._0_4_ = in_stack_fffffffffffffa08;
  sep.size_ = (size_t)in_stack_fffffffffffffa10;
  fmt::v5::join<int*>((int *)in_stack_fffffffffffffa00,
                      (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),sep);
  fmt::v5::format<char[5],fmt::v5::arg_join<int*,char>>
            ((char (*) [5])in_stack_fffffffffffffa28,
             (arg_join<int_*,_char> *)in_stack_fffffffffffffa20._M_current);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (char *)in_stack_fffffffffffffa00,
             (char (*) [10])CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             in_stack_fffffffffffff9f0);
  std::__cxx11::string::~string(local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20._M_current);
    testing::AssertionResult::failure_message((AssertionResult *)0x17b0f5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa20._M_current,in_stack_fffffffffffffa1c,
               (char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
               (char *)in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x17b158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b1b0);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8)
  ;
  sep_00.data_._4_4_ = in_stack_fffffffffffffa0c;
  sep_00.data_._0_4_ = in_stack_fffffffffffffa08;
  sep_00.size_ = (size_t)in_stack_fffffffffffffa10;
  fmt::v5::join<int*>((int *)in_stack_fffffffffffffa00,
                      (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),sep_00);
  fmt::v5::format<char[5],fmt::v5::arg_join<int*,char>>
            ((char (*) [5])in_stack_fffffffffffffa28,
             (arg_join<int_*,_char> *)in_stack_fffffffffffffa20._M_current);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (char *)in_stack_fffffffffffffa00,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             in_stack_fffffffffffff9f0);
  std::__cxx11::string::~string(local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20._M_current);
    testing::AssertionResult::failure_message((AssertionResult *)0x17b301);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa20._M_current,in_stack_fffffffffffffa1c,
               (char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
               (char *)in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x17b364);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b3bc);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8)
  ;
  sep_01.data_._4_4_ = in_stack_fffffffffffffa0c;
  sep_01.data_._0_4_ = in_stack_fffffffffffffa08;
  sep_01.size_ = (size_t)in_stack_fffffffffffffa10;
  fmt::v5::join<int*>((int *)in_stack_fffffffffffffa00,
                      (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),sep_01);
  fmt::v5::format<char[5],fmt::v5::arg_join<int*,char>>
            ((char (*) [5])in_stack_fffffffffffffa28,
             (arg_join<int_*,_char> *)in_stack_fffffffffffffa20._M_current);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (char *)in_stack_fffffffffffffa00,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             in_stack_fffffffffffff9f0);
  std::__cxx11::string::~string(local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20._M_current);
    testing::AssertionResult::failure_message((AssertionResult *)0x17b505);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa20._M_current,in_stack_fffffffffffffa1c,
               (char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
               (char *)in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x17b568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b5c0);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8)
  ;
  sep_02.data_._4_4_ = in_stack_fffffffffffffa0c;
  sep_02.data_._0_4_ = in_stack_fffffffffffffa08;
  sep_02.size_ = (size_t)in_stack_fffffffffffffa10;
  fmt::v5::join<int*>((int *)in_stack_fffffffffffffa00,
                      (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),sep_02);
  fmt::v5::format<char[8],fmt::v5::arg_join<int*,char>>
            ((char (*) [8])in_stack_fffffffffffffa28,
             (arg_join<int_*,_char> *)in_stack_fffffffffffffa20._M_current);
  testing::internal::EqHelper<false>::Compare<char[16],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (char *)in_stack_fffffffffffffa00,
             (char (*) [16])CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             in_stack_fffffffffffff9f0);
  std::__cxx11::string::~string(local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20._M_current);
    testing::AssertionResult::failure_message((AssertionResult *)0x17b711);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa20._M_current,in_stack_fffffffffffffa1c,
               (char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
               (char *)in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x17b774);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b7cc);
  local_270 = (float *)std::vector<float,_std::allocator<float>_>::begin(in_stack_fffffffffffff9e8);
  local_278 = (float *)std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffff9e8);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8)
  ;
  end._M_current._4_4_ = in_stack_fffffffffffffa1c;
  end._M_current._0_4_ = in_stack_fffffffffffffa18;
  sep_03.data_._4_4_ = in_stack_fffffffffffffa0c;
  sep_03.data_._0_4_ = in_stack_fffffffffffffa08;
  sep_03.size_ = (size_t)in_stack_fffffffffffffa10;
  fmt::v5::join<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            (in_stack_fffffffffffffa20,end,sep_03);
  fmt::v5::
  format<char[12],fmt::v5::arg_join<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,char>>
            ((char (*) [12])in_stack_fffffffffffffa28,
             (arg_join<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,_char>
              *)in_stack_fffffffffffffa20._M_current);
  testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (char *)in_stack_fffffffffffffa00,
             (char (*) [17])CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             in_stack_fffffffffffff9f0);
  std::__cxx11::string::~string(local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_228);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20._M_current);
    in_stack_fffffffffffffa70 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x17b92f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa20._M_current,in_stack_fffffffffffffa1c,
               (char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
               (char *)in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x17b992);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b9ea);
  message = &local_c;
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)in_stack_fffffffffffff9f0,
             (wchar_t *)in_stack_fffffffffffff9e8);
  sep_04.data_._4_4_ = in_stack_fffffffffffffa0c;
  sep_04.data_._0_4_ = in_stack_fffffffffffffa08;
  sep_04.size_ = (size_t)in_stack_fffffffffffffa10;
  fmt::v5::join<int*>((int *)in_stack_fffffffffffffa00,
                      (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),sep_04);
  fmt::v5::format<wchar_t[5],fmt::v5::arg_join<int*,wchar_t>>
            (in_stack_fffffffffffffa28,
             (arg_join<int_*,_wchar_t> *)in_stack_fffffffffffffa20._M_current);
  testing::internal::EqHelper<false>::Compare<wchar_t[10],std::__cxx11::wstring>
            ((char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (char *)in_stack_fffffffffffffa00,
             (wchar_t (*) [10])CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff9f0);
  std::__cxx11::wstring::~wstring(local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20._M_current);
    testing::AssertionResult::failure_message((AssertionResult *)0x17bb2f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa20._M_current,in_stack_fffffffffffffa1c,
               (char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
               (char *)in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa70,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x17bb8c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17bbe4);
  args_00 = (arg_join<int_*,_char> *)local_18;
  format_str_00 = &local_c;
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8)
  ;
  sep_05.data_._4_4_ = in_stack_fffffffffffffa0c;
  sep_05.data_._0_4_ = in_stack_fffffffffffffa08;
  sep_05.size_ = (size_t)in_stack_fffffffffffffa10;
  fmt::v5::join<int*>((int *)in_stack_fffffffffffffa00,
                      (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),sep_05);
  local_36c = 1;
  fmt::v5::format<char[8],fmt::v5::arg_join<int*,char>,int>
            ((char (*) [8])format_str_00,args_00,
             (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (char *)in_stack_fffffffffffffa00,
             (char (*) [8])CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             in_stack_fffffffffffff9f0);
  std::__cxx11::string::~string(local_338);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_318);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20._M_current);
    testing::AssertionResult::failure_message((AssertionResult *)0x17bd36);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa20._M_current,in_stack_fffffffffffffa1c,
               (char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
               (char *)in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa70,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x17bd93);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17bdeb);
  fmt::v5::format<char[7],void*,void*>
            ((char (*) [7])format_str_00,&args_00->begin,
             (void **)CONCAT17(uVar2,in_stack_fffffffffffffa38));
  args = &local_58;
  format_str = &local_58.sep;
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8)
  ;
  sep_06.data_._4_4_ = in_stack_fffffffffffffa0c;
  sep_06.data_._0_4_ = in_stack_fffffffffffffa08;
  sep_06.size_ = (size_t)in_stack_fffffffffffffa10;
  fmt::v5::join<void**>
            ((void **)in_stack_fffffffffffffa00,
             (void **)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),sep_06);
  fmt::v5::format<char[3],fmt::v5::arg_join<void**,char>>
            ((char (*) [3])format_str,(arg_join<void_**,_char> *)args);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (char *)in_stack_fffffffffffffa00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),in_stack_fffffffffffff9f0
            );
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::string::~string(local_3b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_390);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa1c);
  if (!bVar1) {
    testing::Message::Message((Message *)args);
    in_stack_fffffffffffffa10 =
         (vector<float,_std::allocator<float>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x17bf81);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)args,type,(char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c
               ,(char *)in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa70,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x17bfde);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17c036);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8)
  ;
  sep_07.data_._4_4_ = type;
  sep_07.data_._0_4_ = in_stack_fffffffffffffa18;
  sep_07.size_ = (size_t)args;
  fmt::v5::join<int[3]>((int (*) [3])in_stack_fffffffffffffa10,sep_07);
  fmt::v5::format<char[5],fmt::v5::arg_join<int_const*,char>>
            ((char (*) [5])format_str,(arg_join<const_int_*,_char> *)args);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (char *)in_stack_fffffffffffffa00,
             (char (*) [10])CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             in_stack_fffffffffffff9f0);
  std::__cxx11::string::~string(local_440);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_420);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa0c);
  if (!bVar1) {
    testing::Message::Message((Message *)args);
    in_stack_fffffffffffffa00 =
         (vector<float,_std::allocator<float>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x17c159);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)args,type,(char *)in_stack_fffffffffffffa10,line,
               (char *)in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa70,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x17c1b6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17c20e);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8)
  ;
  sep_08.data_._4_4_ = type;
  sep_08.data_._0_4_ = in_stack_fffffffffffffa18;
  sep_08.size_ = (size_t)args;
  fmt::v5::join<std::vector<float,std::allocator<float>>>(in_stack_fffffffffffffa10,sep_08);
  fmt::v5::
  format<char[12],fmt::v5::arg_join<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,char>>
            ((char (*) [12])format_str,args);
  testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_fffffffffffffa08),(char *)in_stack_fffffffffffffa00,
             (char (*) [17])CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             in_stack_fffffffffffff9f0);
  std::__cxx11::string::~string(local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_490);
  if (!bVar1) {
    testing::Message::Message((Message *)args);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x17c331)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)args,type,(char *)in_stack_fffffffffffffa10,line,
               (char *)in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa70,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x17c38e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17c3e3);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffa00);
  return;
}

Assistant:

TEST(FormatTest, JoinArg) {
  using fmt::join;
  int v1[3] = { 1, 2, 3 };
  std::vector<float> v2;
  v2.push_back(1.2f);
  v2.push_back(3.4f);
  void *v3[2] = { &v1[0], &v1[1] };

  EXPECT_EQ("(1, 2, 3)", format("({})", join(v1, v1 + 3, ", ")));
  EXPECT_EQ("(1)", format("({})", join(v1, v1 + 1, ", ")));
  EXPECT_EQ("()", format("({})", join(v1, v1, ", ")));
  EXPECT_EQ("(001, 002, 003)", format("({:03})", join(v1, v1 + 3, ", ")));
  EXPECT_EQ("(+01.20, +03.40)",
            format("({:+06.2f})", join(v2.begin(), v2.end(), ", ")));

  EXPECT_EQ(L"(1, 2, 3)", format(L"({})", join(v1, v1 + 3, L", ")));
  EXPECT_EQ("1, 2, 3", format("{0:{1}}", join(v1, v1 + 3, ", "), 1));

  EXPECT_EQ(format("{}, {}", v3[0], v3[1]),
            format("{}", join(v3, v3 + 2, ", ")));

#if FMT_USE_TRAILING_RETURN && (!FMT_GCC_VERSION || FMT_GCC_VERSION >= 405)
  EXPECT_EQ("(1, 2, 3)", format("({})", join(v1, ", ")));
  EXPECT_EQ("(+01.20, +03.40)", format("({:+06.2f})", join(v2, ", ")));
#endif
}